

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eltwise_x86_fma.cpp
# Opt level: O3

int __thiscall
ncnn::Eltwise_x86_fma::forward
          (Eltwise_x86_fma *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  uint uVar4;
  Mat *m;
  Mat *this_00;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  Mat *bottom_blob2;
  pointer pMVar7;
  ulong uVar8;
  uint uVar9;
  float *pfVar10;
  float *pfVar11;
  ulong uVar12;
  pointer pMVar13;
  undefined1 (*pauVar14) [32];
  undefined1 (*pauVar15) [32];
  int iVar16;
  uint uVar17;
  long lVar18;
  undefined1 (*pauVar19) [32];
  uint uVar20;
  ulong uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [16];
  undefined1 in_ZMM2 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [16];
  undefined1 auVar28 [32];
  undefined1 auVar32 [32];
  
  m = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
      super__Vector_impl_data._M_start;
  uVar4 = m->c;
  uVar21 = (ulong)uVar4;
  uVar9 = m->h * m->w * m->d * m->elempack;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  Mat::create_like(this_00,m,opt->blob_allocator);
  iVar16 = -100;
  if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
    iVar16 = (this->super_Eltwise).op_type;
    if (iVar16 == 0) {
      pMVar7 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (0 < (int)uVar4) {
        uVar8 = 0;
        do {
          pfVar10 = (float *)(m->cstep * uVar8 * m->elemsize + (long)m->data);
          pfVar11 = (float *)(pMVar7[1].cstep * uVar8 * pMVar7[1].elemsize + (long)pMVar7[1].data);
          pauVar14 = (undefined1 (*) [32])
                     (this_00->cstep * uVar8 * this_00->elemsize + (long)this_00->data);
          if ((int)uVar9 < 8) {
            uVar17 = 0;
          }
          else {
            iVar16 = 7;
            do {
              auVar5._4_4_ = pfVar11[1] * pfVar10[1];
              auVar5._0_4_ = *pfVar11 * *pfVar10;
              auVar5._8_4_ = pfVar11[2] * pfVar10[2];
              auVar5._12_4_ = pfVar11[3] * pfVar10[3];
              auVar5._16_4_ = pfVar11[4] * pfVar10[4];
              auVar5._20_4_ = pfVar11[5] * pfVar10[5];
              auVar5._24_4_ = pfVar11[6] * pfVar10[6];
              auVar5._28_4_ = pfVar11[7];
              *pauVar14 = auVar5;
              pfVar10 = pfVar10 + 8;
              pfVar11 = pfVar11 + 8;
              pauVar14 = pauVar14 + 1;
              iVar16 = iVar16 + 8;
              uVar17 = uVar9 & 0xfffffff8;
            } while (iVar16 < (int)uVar9);
          }
          uVar20 = uVar17 | 3;
          while ((int)uVar20 < (int)uVar9) {
            auVar22._0_4_ = *pfVar11 * *pfVar10;
            auVar22._4_4_ = pfVar11[1] * pfVar10[1];
            auVar22._8_4_ = pfVar11[2] * pfVar10[2];
            auVar22._12_4_ = pfVar11[3] * pfVar10[3];
            *(undefined1 (*) [16])*pauVar14 = auVar22;
            pfVar10 = pfVar10 + 4;
            pfVar11 = pfVar11 + 4;
            pauVar14 = (undefined1 (*) [32])((long)*pauVar14 + 0x10);
            uVar20 = uVar17 + 7;
            uVar17 = uVar17 + 4;
          }
          if (uVar9 - uVar17 != 0 && (int)uVar17 <= (int)uVar9) {
            lVar18 = 0;
            do {
              *(float *)((long)*pauVar14 + lVar18 * 4) = pfVar11[lVar18] * pfVar10[lVar18];
              lVar18 = lVar18 + 1;
            } while (uVar9 - uVar17 != (int)lVar18);
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 != uVar21);
        pMVar7 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      }
      pMVar13 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      if (2 < (ulong)(((long)pMVar13 - (long)pMVar7 >> 3) * -0x71c71c71c71c71c7)) {
        uVar8 = 2;
        do {
          if (0 < (int)uVar4) {
            pMVar7 = pMVar7 + uVar8;
            uVar12 = 0;
            do {
              pfVar10 = (float *)(pMVar7->cstep * uVar12 * pMVar7->elemsize + (long)pMVar7->data);
              pauVar14 = (undefined1 (*) [32])
                         (this_00->cstep * uVar12 * this_00->elemsize + (long)this_00->data);
              uVar17 = 0;
              if (7 < (int)uVar9) {
                iVar16 = 7;
                do {
                  auVar6._4_4_ = pfVar10[1] * *(float *)((long)*pauVar14 + 4);
                  auVar6._0_4_ = *pfVar10 * *(float *)*pauVar14;
                  auVar6._8_4_ = pfVar10[2] * *(float *)((long)*pauVar14 + 8);
                  auVar6._12_4_ = pfVar10[3] * *(float *)((long)*pauVar14 + 0xc);
                  auVar6._16_4_ = pfVar10[4] * *(float *)((long)*pauVar14 + 0x10);
                  auVar6._20_4_ = pfVar10[5] * *(float *)((long)*pauVar14 + 0x14);
                  auVar6._24_4_ = pfVar10[6] * *(float *)((long)*pauVar14 + 0x18);
                  auVar6._28_4_ = pfVar10[7];
                  *pauVar14 = auVar6;
                  pfVar10 = pfVar10 + 8;
                  pauVar14 = pauVar14 + 1;
                  iVar16 = iVar16 + 8;
                  uVar17 = uVar9 & 0xfffffff8;
                } while (iVar16 < (int)uVar9);
              }
              uVar20 = uVar17 | 3;
              while ((int)uVar20 < (int)uVar9) {
                auVar23._0_4_ = *pfVar10 * *(float *)*pauVar14;
                auVar23._4_4_ = pfVar10[1] * *(float *)((long)*pauVar14 + 4);
                auVar23._8_4_ = pfVar10[2] * *(float *)((long)*pauVar14 + 8);
                auVar23._12_4_ = pfVar10[3] * *(float *)((long)*pauVar14 + 0xc);
                *(undefined1 (*) [16])*pauVar14 = auVar23;
                pfVar10 = pfVar10 + 4;
                pauVar14 = (undefined1 (*) [32])((long)*pauVar14 + 0x10);
                uVar20 = uVar17 + 7;
                uVar17 = uVar17 + 4;
              }
              if (uVar9 - uVar17 != 0 && (int)uVar17 <= (int)uVar9) {
                lVar18 = 0;
                do {
                  *(float *)((long)*pauVar14 + lVar18 * 4) =
                       *(float *)((long)*pauVar14 + lVar18 * 4) * pfVar10[lVar18];
                  lVar18 = lVar18 + 1;
                } while (uVar9 - uVar17 != (int)lVar18);
              }
              uVar12 = uVar12 + 1;
            } while (uVar12 != uVar21);
            pMVar7 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            pMVar13 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_finish;
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 < (ulong)(((long)pMVar13 - (long)pMVar7 >> 3) * -0x71c71c71c71c71c7));
      }
      iVar16 = (this->super_Eltwise).op_type;
    }
    if (iVar16 == 1) {
      pMVar7 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((this->super_Eltwise).coeffs.w == 0) {
        if (0 < (int)uVar4) {
          uVar8 = 0;
          do {
            pfVar10 = (float *)(m->cstep * uVar8 * m->elemsize + (long)m->data);
            pfVar11 = (float *)(pMVar7[1].cstep * uVar8 * pMVar7[1].elemsize + (long)pMVar7[1].data)
            ;
            pauVar14 = (undefined1 (*) [32])
                       (this_00->cstep * uVar8 * this_00->elemsize + (long)this_00->data);
            if ((int)uVar9 < 8) {
              uVar17 = 0;
            }
            else {
              iVar16 = 7;
              do {
                auVar29._0_4_ = *pfVar11 + *pfVar10;
                auVar29._4_4_ = pfVar11[1] + pfVar10[1];
                auVar29._8_4_ = pfVar11[2] + pfVar10[2];
                auVar29._12_4_ = pfVar11[3] + pfVar10[3];
                auVar29._16_4_ = pfVar11[4] + pfVar10[4];
                auVar29._20_4_ = pfVar11[5] + pfVar10[5];
                auVar29._24_4_ = pfVar11[6] + pfVar10[6];
                auVar29._28_4_ = pfVar11[7] + pfVar10[7];
                *pauVar14 = auVar29;
                pfVar10 = pfVar10 + 8;
                pfVar11 = pfVar11 + 8;
                pauVar14 = pauVar14 + 1;
                iVar16 = iVar16 + 8;
                uVar17 = uVar9 & 0xfffffff8;
              } while (iVar16 < (int)uVar9);
            }
            uVar20 = uVar17 | 3;
            while ((int)uVar20 < (int)uVar9) {
              auVar26._0_4_ = *pfVar11 + *pfVar10;
              auVar26._4_4_ = pfVar11[1] + pfVar10[1];
              auVar26._8_4_ = pfVar11[2] + pfVar10[2];
              auVar26._12_4_ = pfVar11[3] + pfVar10[3];
              *(undefined1 (*) [16])*pauVar14 = auVar26;
              pfVar10 = pfVar10 + 4;
              pfVar11 = pfVar11 + 4;
              pauVar14 = (undefined1 (*) [32])((long)*pauVar14 + 0x10);
              uVar20 = uVar17 + 7;
              uVar17 = uVar17 + 4;
            }
            if (uVar9 - uVar17 != 0 && (int)uVar17 <= (int)uVar9) {
              lVar18 = 0;
              do {
                *(float *)((long)*pauVar14 + lVar18 * 4) = pfVar11[lVar18] + pfVar10[lVar18];
                lVar18 = lVar18 + 1;
              } while (uVar9 - uVar17 != (int)lVar18);
            }
            uVar8 = uVar8 + 1;
          } while (uVar8 != uVar21);
          pMVar7 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_start;
        }
        pMVar13 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
        if (2 < (ulong)(((long)pMVar13 - (long)pMVar7 >> 3) * -0x71c71c71c71c71c7)) {
          uVar8 = 2;
          do {
            if (0 < (int)uVar4) {
              pMVar7 = pMVar7 + uVar8;
              uVar12 = 0;
              do {
                pfVar10 = (float *)(pMVar7->cstep * uVar12 * pMVar7->elemsize + (long)pMVar7->data);
                pauVar14 = (undefined1 (*) [32])
                           (this_00->cstep * uVar12 * this_00->elemsize + (long)this_00->data);
                uVar17 = 0;
                if (7 < (int)uVar9) {
                  iVar16 = 7;
                  do {
                    auVar30._0_4_ = *pfVar10 + *(float *)*pauVar14;
                    auVar30._4_4_ = pfVar10[1] + *(float *)((long)*pauVar14 + 4);
                    auVar30._8_4_ = pfVar10[2] + *(float *)((long)*pauVar14 + 8);
                    auVar30._12_4_ = pfVar10[3] + *(float *)((long)*pauVar14 + 0xc);
                    auVar30._16_4_ = pfVar10[4] + *(float *)((long)*pauVar14 + 0x10);
                    auVar30._20_4_ = pfVar10[5] + *(float *)((long)*pauVar14 + 0x14);
                    auVar30._24_4_ = pfVar10[6] + *(float *)((long)*pauVar14 + 0x18);
                    auVar30._28_4_ = pfVar10[7] + *(float *)((long)*pauVar14 + 0x1c);
                    *pauVar14 = auVar30;
                    pfVar10 = pfVar10 + 8;
                    pauVar14 = pauVar14 + 1;
                    iVar16 = iVar16 + 8;
                    uVar17 = uVar9 & 0xfffffff8;
                  } while (iVar16 < (int)uVar9);
                }
                uVar20 = uVar17 | 3;
                while ((int)uVar20 < (int)uVar9) {
                  auVar27._0_4_ = *pfVar10 + *(float *)*pauVar14;
                  auVar27._4_4_ = pfVar10[1] + *(float *)((long)*pauVar14 + 4);
                  auVar27._8_4_ = pfVar10[2] + *(float *)((long)*pauVar14 + 8);
                  auVar27._12_4_ = pfVar10[3] + *(float *)((long)*pauVar14 + 0xc);
                  *(undefined1 (*) [16])*pauVar14 = auVar27;
                  pfVar10 = pfVar10 + 4;
                  pauVar14 = (undefined1 (*) [32])((long)*pauVar14 + 0x10);
                  uVar20 = uVar17 + 7;
                  uVar17 = uVar17 + 4;
                }
                if (uVar9 - uVar17 != 0 && (int)uVar17 <= (int)uVar9) {
                  lVar18 = 0;
                  do {
                    *(float *)((long)*pauVar14 + lVar18 * 4) =
                         *(float *)((long)*pauVar14 + lVar18 * 4) + pfVar10[lVar18];
                    lVar18 = lVar18 + 1;
                  } while (uVar9 - uVar17 != (int)lVar18);
                }
                uVar12 = uVar12 + 1;
              } while (uVar12 != uVar21);
              pMVar7 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                       _M_impl.super__Vector_impl_data._M_start;
              pMVar13 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_finish;
            }
            uVar8 = uVar8 + 1;
          } while (uVar8 < (ulong)(((long)pMVar13 - (long)pMVar7 >> 3) * -0x71c71c71c71c71c7));
        }
      }
      else {
        if (0 < (int)uVar4) {
          uVar8 = 0;
          do {
            pfVar11 = (float *)(m->cstep * uVar8 * m->elemsize + (long)m->data);
            pauVar14 = (undefined1 (*) [32])
                       (pMVar7[1].cstep * uVar8 * pMVar7[1].elemsize + (long)pMVar7[1].data);
            pauVar15 = (undefined1 (*) [32])
                       (this_00->cstep * uVar8 * this_00->elemsize + (long)this_00->data);
            pfVar10 = (float *)(this->super_Eltwise).coeffs.data;
            fVar1 = *pfVar10;
            auVar24._4_4_ = fVar1;
            auVar24._0_4_ = fVar1;
            auVar24._8_4_ = fVar1;
            auVar24._12_4_ = fVar1;
            fVar2 = pfVar10[1];
            auVar31._4_4_ = fVar2;
            auVar31._0_4_ = fVar2;
            auVar31._8_4_ = fVar2;
            auVar31._12_4_ = fVar2;
            auVar32._16_4_ = fVar2;
            auVar32._0_16_ = auVar31;
            auVar32._20_4_ = fVar2;
            auVar32._24_4_ = fVar2;
            auVar32._28_4_ = fVar2;
            if ((int)uVar9 < 8) {
              uVar17 = 0;
            }
            else {
              iVar16 = 7;
              do {
                auVar33._0_4_ = fVar1 * *pfVar11;
                auVar33._4_4_ = fVar1 * pfVar11[1];
                auVar33._8_4_ = fVar1 * pfVar11[2];
                auVar33._12_4_ = fVar1 * pfVar11[3];
                auVar33._16_4_ = fVar1 * pfVar11[4];
                auVar33._20_4_ = fVar1 * pfVar11[5];
                auVar33._28_36_ = in_ZMM2._28_36_;
                auVar33._24_4_ = fVar1 * pfVar11[6];
                auVar22 = vfmadd231ps_fma(auVar33._0_32_,auVar32,*pauVar14);
                in_ZMM2 = ZEXT1664(auVar22);
                *pauVar15 = ZEXT1632(auVar22);
                pfVar11 = pfVar11 + 8;
                pauVar14 = pauVar14 + 1;
                pauVar15 = pauVar15 + 1;
                iVar16 = iVar16 + 8;
                uVar17 = uVar9 & 0xfffffff8;
              } while (iVar16 < (int)uVar9);
            }
            if ((int)(uVar17 | 3) < (int)uVar9) {
              auVar22 = vshufps_avx(auVar24,auVar24,0);
              in_ZMM2 = ZEXT1664(auVar22);
              auVar23 = vshufps_avx(auVar31,auVar31,0);
              uVar20 = uVar17;
              do {
                auVar34._0_4_ = auVar22._0_4_ * *pfVar11;
                auVar34._4_4_ = auVar22._4_4_ * pfVar11[1];
                auVar34._8_4_ = auVar22._8_4_ * pfVar11[2];
                auVar34._12_4_ = auVar22._12_4_ * pfVar11[3];
                auVar26 = vfmadd231ps_fma(auVar34,auVar23,*(undefined1 (*) [16])*pauVar14);
                *(undefined1 (*) [16])*pauVar15 = auVar26;
                pfVar11 = pfVar11 + 4;
                pauVar14 = (undefined1 (*) [32])(*pauVar14 + 0x10);
                pauVar15 = (undefined1 (*) [32])((long)*pauVar15 + 0x10);
                uVar17 = uVar20 + 4;
                iVar16 = uVar20 + 7;
                uVar20 = uVar17;
              } while (iVar16 < (int)uVar9);
            }
            if (uVar9 - uVar17 != 0 && (int)uVar17 <= (int)uVar9) {
              lVar18 = 0;
              do {
                auVar22 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * pfVar11[lVar18])),auVar31,
                                          ZEXT416(*(uint *)(*pauVar14 + lVar18 * 4)));
                in_ZMM2 = ZEXT1664(auVar22);
                *(int *)((long)*pauVar15 + lVar18 * 4) = auVar22._0_4_;
                lVar18 = lVar18 + 1;
              } while (uVar9 - uVar17 != (int)lVar18);
            }
            uVar8 = uVar8 + 1;
          } while (uVar8 != uVar21);
          pMVar7 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_start;
        }
        pMVar13 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
        if (2 < (ulong)(((long)pMVar13 - (long)pMVar7 >> 3) * -0x71c71c71c71c71c7)) {
          uVar8 = 2;
          do {
            if (0 < (int)uVar4) {
              pMVar7 = pMVar7 + uVar8;
              uVar12 = 0;
              do {
                pauVar14 = (undefined1 (*) [32])
                           (pMVar7->cstep * uVar12 * pMVar7->elemsize + (long)pMVar7->data);
                pauVar15 = (undefined1 (*) [32])
                           (this_00->cstep * uVar12 * this_00->elemsize + (long)this_00->data);
                uVar3 = *(undefined4 *)((long)(this->super_Eltwise).coeffs.data + uVar8 * 4);
                auVar25._4_4_ = uVar3;
                auVar25._0_4_ = uVar3;
                auVar25._8_4_ = uVar3;
                auVar25._12_4_ = uVar3;
                auVar28._16_4_ = uVar3;
                auVar28._0_16_ = auVar25;
                auVar28._20_4_ = uVar3;
                auVar28._24_4_ = uVar3;
                auVar28._28_4_ = uVar3;
                uVar17 = 0;
                if (7 < (int)uVar9) {
                  iVar16 = 7;
                  do {
                    auVar22 = vfmadd213ps_fma(*pauVar14,auVar28,*pauVar15);
                    *pauVar15 = ZEXT1632(auVar22);
                    pauVar14 = pauVar14 + 1;
                    pauVar15 = pauVar15 + 1;
                    iVar16 = iVar16 + 8;
                    uVar17 = uVar9 & 0xfffffff8;
                  } while (iVar16 < (int)uVar9);
                }
                if ((int)(uVar17 | 3) < (int)uVar9) {
                  auVar22 = vshufps_avx(auVar25,auVar25,0);
                  uVar20 = uVar17;
                  do {
                    auVar23 = vfmadd213ps_fma(*(undefined1 (*) [16])*pauVar14,auVar22,
                                              *(undefined1 (*) [16])*pauVar15);
                    *(undefined1 (*) [16])*pauVar15 = auVar23;
                    pauVar14 = (undefined1 (*) [32])(*pauVar14 + 0x10);
                    pauVar15 = (undefined1 (*) [32])(*pauVar15 + 0x10);
                    uVar17 = uVar20 + 4;
                    iVar16 = uVar20 + 7;
                    uVar20 = uVar17;
                  } while (iVar16 < (int)uVar9);
                }
                if (uVar9 - uVar17 != 0 && (int)uVar17 <= (int)uVar9) {
                  lVar18 = 0;
                  do {
                    auVar22 = vfmadd213ss_fma(ZEXT416(*(uint *)(*pauVar14 + lVar18 * 4)),auVar25,
                                              ZEXT416(*(uint *)(*pauVar15 + lVar18 * 4)));
                    *(int *)(*pauVar15 + lVar18 * 4) = auVar22._0_4_;
                    lVar18 = lVar18 + 1;
                  } while (uVar9 - uVar17 != (int)lVar18);
                }
                uVar12 = uVar12 + 1;
              } while (uVar12 != uVar21);
              pMVar7 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                       _M_impl.super__Vector_impl_data._M_start;
              pMVar13 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_finish;
            }
            uVar8 = uVar8 + 1;
          } while (uVar8 < (ulong)(((long)pMVar13 - (long)pMVar7 >> 3) * -0x71c71c71c71c71c7));
        }
      }
    }
    iVar16 = 0;
    if ((this->super_Eltwise).op_type == 2) {
      pMVar7 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (0 < (int)uVar4) {
        uVar8 = 0;
        do {
          pauVar14 = (undefined1 (*) [32])(m->cstep * uVar8 * m->elemsize + (long)m->data);
          pauVar15 = (undefined1 (*) [32])
                     (pMVar7[1].cstep * uVar8 * pMVar7[1].elemsize + (long)pMVar7[1].data);
          pauVar19 = (undefined1 (*) [32])
                     (this_00->cstep * uVar8 * this_00->elemsize + (long)this_00->data);
          if ((int)uVar9 < 8) {
            uVar17 = 0;
          }
          else {
            iVar16 = 7;
            do {
              auVar5 = vmaxps_avx(*pauVar14,*pauVar15);
              *pauVar19 = auVar5;
              pauVar14 = pauVar14 + 1;
              pauVar15 = pauVar15 + 1;
              pauVar19 = pauVar19 + 1;
              iVar16 = iVar16 + 8;
              uVar17 = uVar9 & 0xfffffff8;
            } while (iVar16 < (int)uVar9);
          }
          uVar20 = uVar17 | 3;
          while ((int)uVar20 < (int)uVar9) {
            auVar22 = vmaxps_avx(*(undefined1 (*) [16])*pauVar14,*(undefined1 (*) [16])*pauVar15);
            *(undefined1 (*) [16])*pauVar19 = auVar22;
            pauVar14 = (undefined1 (*) [32])(*pauVar14 + 0x10);
            pauVar15 = (undefined1 (*) [32])(*pauVar15 + 0x10);
            pauVar19 = (undefined1 (*) [32])((long)*pauVar19 + 0x10);
            uVar20 = uVar17 + 7;
            uVar17 = uVar17 + 4;
          }
          if (uVar9 - uVar17 != 0 && (int)uVar17 <= (int)uVar9) {
            lVar18 = 0;
            do {
              auVar22 = vmaxss_avx(ZEXT416(*(uint *)(*pauVar15 + lVar18 * 4)),
                                   ZEXT416(*(uint *)(*pauVar14 + lVar18 * 4)));
              *(int *)((long)*pauVar19 + lVar18 * 4) = auVar22._0_4_;
              lVar18 = lVar18 + 1;
            } while (uVar9 - uVar17 != (int)lVar18);
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 != uVar21);
        pMVar7 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      }
      pMVar13 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      iVar16 = 0;
      if (2 < (ulong)(((long)pMVar13 - (long)pMVar7 >> 3) * -0x71c71c71c71c71c7)) {
        uVar8 = 2;
        do {
          if (0 < (int)uVar4) {
            pMVar7 = pMVar7 + uVar8;
            uVar12 = 0;
            do {
              pauVar14 = (undefined1 (*) [32])
                         (pMVar7->cstep * uVar12 * pMVar7->elemsize + (long)pMVar7->data);
              pauVar15 = (undefined1 (*) [32])
                         (this_00->cstep * uVar12 * this_00->elemsize + (long)this_00->data);
              uVar17 = 0;
              if (7 < (int)uVar9) {
                iVar16 = 7;
                do {
                  auVar5 = vmaxps_avx(*pauVar15,*pauVar14);
                  *pauVar15 = auVar5;
                  pauVar14 = pauVar14 + 1;
                  pauVar15 = pauVar15 + 1;
                  iVar16 = iVar16 + 8;
                  uVar17 = uVar9 & 0xfffffff8;
                } while (iVar16 < (int)uVar9);
              }
              uVar20 = uVar17 | 3;
              while ((int)uVar20 < (int)uVar9) {
                auVar22 = vmaxps_avx(*(undefined1 (*) [16])*pauVar15,*(undefined1 (*) [16])*pauVar14
                                    );
                *(undefined1 (*) [16])*pauVar15 = auVar22;
                pauVar14 = (undefined1 (*) [32])(*pauVar14 + 0x10);
                pauVar15 = (undefined1 (*) [32])(*pauVar15 + 0x10);
                uVar20 = uVar17 + 7;
                uVar17 = uVar17 + 4;
              }
              if (uVar9 - uVar17 != 0 && (int)uVar17 <= (int)uVar9) {
                lVar18 = 0;
                do {
                  auVar22 = vmaxss_avx(ZEXT416(*(uint *)(*pauVar15 + lVar18 * 4)),
                                       ZEXT416(*(uint *)(*pauVar14 + lVar18 * 4)));
                  *(int *)(*pauVar15 + lVar18 * 4) = auVar22._0_4_;
                  lVar18 = lVar18 + 1;
                } while (uVar9 - uVar17 != (int)lVar18);
              }
              uVar12 = uVar12 + 1;
            } while (uVar12 != uVar21);
            pMVar7 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            pMVar13 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_finish;
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 < (ulong)(((long)pMVar13 - (long)pMVar7 >> 3) * -0x71c71c71c71c71c7));
        iVar16 = 0;
      }
    }
  }
  return iVar16;
}

Assistant:

int Eltwise_x86_fma::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int elempack = bottom_blob.elempack;
    int size = w * h * d * elempack;

    Mat& top_blob = top_blobs[0];
    top_blob.create_like(bottom_blob, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (op_type == Operation_PROD)
    {
        // first blob
        const Mat& bottom_blob1 = bottom_blobs[1];
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            const float* ptr1 = bottom_blob1.channel(q);
            float* outptr = top_blob.channel(q);

            int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __m512 _p1 = _mm512_loadu_ps(ptr1);
                _p = _mm512_mul_ps(_p, _p1);
                _mm512_storeu_ps(outptr, _p);

                ptr += 16;
                ptr1 += 16;
                outptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _p1 = _mm256_loadu_ps(ptr1);
                _p = _mm256_mul_ps(_p, _p1);
                _mm256_storeu_ps(outptr, _p);

                ptr += 8;
                ptr1 += 8;
                outptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_load_ps(ptr);
                __m128 _p1 = _mm_load_ps(ptr1);
                _p = _mm_mul_ps(_p, _p1);
                _mm_store_ps(outptr, _p);

                ptr += 4;
                ptr1 += 4;
                outptr += 4;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
                *outptr = *ptr * *ptr1;

                ptr++;
                ptr1++;
                outptr++;
            }
        }

        for (size_t b = 2; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob2 = bottom_blobs[b];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob2.channel(q);
                float* outptr = top_blob.channel(q);

                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(outptr);
                    __m512 _p1 = _mm512_loadu_ps(ptr);
                    _p = _mm512_mul_ps(_p, _p1);
                    _mm512_storeu_ps(outptr, _p);

                    ptr += 16;
                    outptr += 16;
                }
#endif // __AVX512F__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(outptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr);
                    _p = _mm256_mul_ps(_p, _p1);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    outptr += 8;
                }
#endif // __AVX__
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_load_ps(outptr);
                    __m128 _p1 = _mm_load_ps(ptr);
                    _p = _mm_mul_ps(_p, _p1);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    outptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *outptr *= *ptr;

                    ptr++;
                    outptr++;
                }
            }
        }
    }
    if (op_type == Operation_SUM)
    {
        if (coeffs.w == 0)
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    __m512 _p1 = _mm512_loadu_ps(ptr1);
                    _p = _mm512_add_ps(_p, _p1);
                    _mm512_storeu_ps(outptr, _p);

                    ptr += 16;
                    ptr1 += 16;
                    outptr += 16;
                }
#endif // __AVX512F__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr1);
                    _p = _mm256_add_ps(_p, _p1);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    ptr1 += 8;
                    outptr += 8;
                }
#endif // __AVX__
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_load_ps(ptr);
                    __m128 _p1 = _mm_load_ps(ptr1);
                    _p = _mm_add_ps(_p, _p1);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    ptr1 += 4;
                    outptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *outptr = *ptr + *ptr1;

                    ptr++;
                    ptr1++;
                    outptr++;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                    for (; i + 15 < size; i += 16)
                    {
                        __m512 _p = _mm512_loadu_ps(outptr);
                        __m512 _p1 = _mm512_loadu_ps(ptr);
                        _p = _mm512_add_ps(_p, _p1);
                        _mm512_storeu_ps(outptr, _p);

                        ptr += 16;
                        outptr += 16;
                    }
#endif // __AVX512F__
                    for (; i + 7 < size; i += 8)
                    {
                        __m256 _p = _mm256_loadu_ps(outptr);
                        __m256 _p1 = _mm256_loadu_ps(ptr);
                        _p = _mm256_add_ps(_p, _p1);
                        _mm256_storeu_ps(outptr, _p);

                        ptr += 8;
                        outptr += 8;
                    }
#endif // __AVX__
                    for (; i + 3 < size; i += 4)
                    {
                        __m128 _p = _mm_load_ps(outptr);
                        __m128 _p1 = _mm_load_ps(ptr);
                        _p = _mm_add_ps(_p, _p1);
                        _mm_store_ps(outptr, _p);

                        ptr += 4;
                        outptr += 4;
                    }
#endif // __SSE2__
                    for (; i < size; i++)
                    {
                        *outptr += *ptr;

                        ptr++;
                        outptr++;
                    }
                }
            }
        }
        else
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                const float coeff0 = coeffs[0];
                const float coeff1 = coeffs[1];

                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _coeff0_avx512 = _mm512_set1_ps(coeff0);
                __m512 _coeff1_avx512 = _mm512_set1_ps(coeff1);
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    __m512 _p1 = _mm512_loadu_ps(ptr1);
                    _p = _mm512_mul_ps(_p, _coeff0_avx512);
                    _p = _mm512_fmadd_ps(_p1, _coeff1_avx512, _p);
                    _mm512_storeu_ps(outptr, _p);

                    ptr += 16;
                    ptr1 += 16;
                    outptr += 16;
                }
#endif // __AVX512F__
                __m256 _coeff0_avx = _mm256_set1_ps(coeff0);
                __m256 _coeff1_avx = _mm256_set1_ps(coeff1);
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr1);
                    _p = _mm256_mul_ps(_p, _coeff0_avx);
                    _p = _mm256_comp_fmadd_ps(_p1, _coeff1_avx, _p);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    ptr1 += 8;
                    outptr += 8;
                }
#endif // __AVX__
                __m128 _coeff0 = _mm_set1_ps(coeff0);
                __m128 _coeff1 = _mm_set1_ps(coeff1);
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_load_ps(ptr);
                    __m128 _p1 = _mm_load_ps(ptr1);
                    _p = _mm_mul_ps(_p, _coeff0);
                    _p1 = _mm_mul_ps(_p1, _coeff1);
                    _p = _mm_add_ps(_p1, _p);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    ptr1 += 4;
                    outptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *outptr = *ptr * coeff0 + *ptr1 * coeff1;

                    ptr++;
                    ptr1++;
                    outptr++;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    const float coeff = coeffs[b];

                    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                    __m512 _coeff_avx512 = _mm512_set1_ps(coeff);
                    for (; i + 15 < size; i += 16)
                    {
                        __m512 _p = _mm512_loadu_ps(outptr);
                        __m512 _p1 = _mm512_loadu_ps(ptr);
                        _p = _mm512_fmadd_ps(_p1, _coeff_avx512, _p);
                        _mm512_storeu_ps(outptr, _p);

                        ptr += 16;
                        outptr += 16;
                    }
#endif // __AVX512F__
                    __m256 _coeff_avx = _mm256_set1_ps(coeff);
                    for (; i + 7 < size; i += 8)
                    {
                        __m256 _p = _mm256_loadu_ps(outptr);
                        __m256 _p1 = _mm256_loadu_ps(ptr);
                        _p = _mm256_comp_fmadd_ps(_p1, _coeff_avx, _p);
                        _mm256_storeu_ps(outptr, _p);

                        ptr += 8;
                        outptr += 8;
                    }
#endif // __AVX__
                    __m128 _coeff = _mm_set1_ps(coeff);
                    for (; i + 3 < size; i += 4)
                    {
                        __m128 _p1 = _mm_load_ps(ptr);
                        __m128 _p = _mm_load_ps(outptr);
                        _p1 = _mm_mul_ps(_p1, _coeff);
                        _p = _mm_add_ps(_p1, _p);
                        _mm_store_ps(outptr, _p);

                        ptr += 4;
                        outptr += 4;
                    }
#endif // __SSE2__
                    for (; i < size; i++)
                    {
                        *outptr += *ptr * coeff;

                        ptr++;
                        outptr++;
                    }
                }
            }
        }
    }
    if (op_type == Operation_MAX)
    {
        // first blob
        const Mat& bottom_blob1 = bottom_blobs[1];
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            const float* ptr1 = bottom_blob1.channel(q);
            float* outptr = top_blob.channel(q);

            int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __m512 _p1 = _mm512_loadu_ps(ptr1);
                _p = _mm512_max_ps(_p, _p1);
                _mm512_storeu_ps(outptr, _p);

                ptr += 16;
                ptr1 += 16;
                outptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _p1 = _mm256_loadu_ps(ptr1);
                _p = _mm256_max_ps(_p, _p1);
                _mm256_storeu_ps(outptr, _p);

                ptr += 8;
                ptr1 += 8;
                outptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_load_ps(ptr);
                __m128 _p1 = _mm_load_ps(ptr1);
                _p = _mm_max_ps(_p, _p1);
                _mm_store_ps(outptr, _p);

                ptr += 4;
                ptr1 += 4;
                outptr += 4;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
                *outptr = std::max(*ptr, *ptr1);

                ptr++;
                ptr1++;
                outptr++;
            }
        }

        for (size_t b = 2; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob2 = bottom_blobs[b];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob2.channel(q);
                float* outptr = top_blob.channel(q);

                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(outptr);
                    __m512 _p1 = _mm512_loadu_ps(ptr);
                    _p = _mm512_max_ps(_p, _p1);
                    _mm512_storeu_ps(outptr, _p);

                    ptr += 16;
                    outptr += 16;
                }
#endif // __AVX512F__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(outptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr);
                    _p = _mm256_max_ps(_p, _p1);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    outptr += 8;
                }
#endif // __AVX__
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_load_ps(outptr);
                    __m128 _p1 = _mm_load_ps(ptr);
                    _p = _mm_max_ps(_p, _p1);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    outptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *outptr = std::max(*ptr, *outptr);

                    ptr++;
                    outptr++;
                }
            }
        }
    }

    return 0;
}